

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XercesDOMParser.cpp
# Opt level: O2

void __thiscall xercesc_4_0::XercesDOMParser::resolveEntity(XercesDOMParser *this)

{
  XMLResourceIdentifier *in_RSI;
  
  resolveEntity((XercesDOMParser *)&this[-1].fXMLEntityResolver,in_RSI);
  return;
}

Assistant:

InputSource*
XercesDOMParser::resolveEntity(XMLResourceIdentifier* resourceIdentifier)
{
    //
    //  Just map it to the SAX entity resolver. If there is not one installed,
    //  return a null pointer to cause the default resolution.
    //
    if (fEntityResolver)
        return fEntityResolver->resolveEntity(resourceIdentifier->getPublicId(),
                                                resourceIdentifier->getSystemId());
    if (fXMLEntityResolver)
        return fXMLEntityResolver->resolveEntity(resourceIdentifier);

    return 0;
}